

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<int> * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::ValidateNumberConversion<int,float>
          (StatusOr<int> *__return_storage_ptr__,_anonymous_namespace_ *this,int after,float before)

{
  int iVar1;
  char *pcVar2;
  undefined *in_RCX;
  float fVar3;
  StringPiece value_str;
  string local_70;
  undefined1 local_50 [44];
  int local_24 [2];
  int after_local;
  
  local_24[0] = (int)this;
  if (((float)local_24[0] == before) && (!NAN((float)local_24[0]) && !NAN(before))) {
    in_RCX = (undefined *)CONCAT71((int7)((ulong)in_RCX >> 8),0.0 < before);
    fVar3 = before;
    if (before != 0.0) {
      in_RCX = &DAT_0036c590;
      fVar3 = *(float *)(&DAT_0036c590 + (ulong)(0.0 < before) * 4);
    }
    iVar1 = ((0 < local_24[0]) - 1) + (uint)(0 < local_24[0]);
    if (local_24[0] == 0) {
      iVar1 = 0;
    }
    if ((fVar3 == (float)iVar1) && (!NAN(fVar3) && !NAN((float)iVar1))) {
      StatusOr<int>::StatusOr(__return_storage_ptr__,local_24);
      return __return_storage_ptr__;
    }
  }
  FloatAsString_abi_cxx11_(&local_70,(converter *)this,before);
  pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
  value_str.length_ = (stringpiece_ssize_type)in_RCX;
  value_str.ptr_ = pcVar2;
  anon_unknown_1::InvalidArgument
            ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str);
  StatusOr<int>::StatusOr(__return_storage_ptr__,(Status *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> ValidateNumberConversion(To after, From before) {
  if (after == before &&
      MathUtil::Sign<From>(before) == MathUtil::Sign<To>(after)) {
    return after;
  } else {
    return InvalidArgument(std::is_integral<From>::value
                               ? ValueAsString(before)
                               : std::is_same<From, double>::value
                                     ? DoubleAsString(before)
                                     : FloatAsString(before));
  }
}